

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

sz_ssize_t __thiscall sznet::net::Buffer::readFd(Buffer *this,sz_sock fd,int *savedErrno)

{
  size_t sVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  sz_ssize_t sVar6;
  sz_ssize_t n;
  size_t writable;
  char *buf;
  int *savedErrno_local;
  sz_sock fd_local;
  Buffer *this_local;
  
  pcVar3 = begin(this);
  sVar1 = this->m_writerIndex;
  pcVar4 = begin(this);
  if (pcVar4 + this->m_wrapSize <= pcVar3 + sVar1) {
    wrapBuffer(this);
  }
  pcVar3 = begin(this);
  sVar1 = this->m_writerIndex;
  sVar5 = writableBytes(this);
  sVar6 = sockets::sz_read(fd,pcVar3 + sVar1,(int)sVar5);
  if (sVar6 < 0) {
    iVar2 = sz_getlasterr();
    *savedErrno = iVar2;
  }
  else {
    this->m_writerIndex = sVar6 + this->m_writerIndex;
  }
  return sVar6;
}

Assistant:

sz_ssize_t Buffer::readFd(sockets::sz_sock fd, int* savedErrno)
{
	// �ж��Ƿ���Ҫ�ص�
	if ((begin() + m_writerIndex) >= (begin() + m_wrapSize))
	{
		wrapBuffer();
	}

	char* buf = (begin() + m_writerIndex);
	const size_t writable = writableBytes();
	const sz_ssize_t n = sockets::sz_read(fd, buf, static_cast<int>(writable));
	if (n < 0)
	{
		*savedErrno = sz_getlasterr();
	}
	else
	{
		m_writerIndex += n;
	}
	
	return n;
}